

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O2

aiNode * ImportNode(aiScene *pScene,Asset *r,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets,
                   Ref<glTF::Node> *ptr)

{
  aiMatrix4x4 *m;
  Node *pNVar1;
  pointer pRVar2;
  pointer pRVar3;
  aiNode *this;
  ulong uVar4;
  aiNode **ppaVar5;
  aiNode *paVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  pointer puVar11;
  uint i;
  pointer pRVar12;
  long lVar13;
  pointer pRVar14;
  bool bVar15;
  aiQuaterniont<float> local_a8;
  aiMatrix4x4t<float> temp;
  aiMatrix3x3t<float> local_58;
  
  pNVar1 = (ptr->vector->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
           super__Vector_impl_data._M_start[ptr->index];
  this = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this,&(pNVar1->super_Object).id);
  pRVar2 = *(pointer *)
            &(pNVar1->children).
             super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
             _M_impl;
  pRVar3 = *(pointer *)
            ((long)&(pNVar1->children).
                    super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
            + 8);
  if (pRVar2 != pRVar3) {
    uVar4 = (long)pRVar3 - (long)pRVar2;
    uVar10 = uVar4 >> 4;
    this->mNumChildren = (uint)uVar10;
    ppaVar5 = (aiNode **)operator_new__(uVar4 >> 1 & 0x7fffffff8);
    this->mChildren = ppaVar5;
    lVar13 = 0;
    for (uVar4 = 0; uVar4 < (uVar10 & 0xffffffff); uVar4 = uVar4 + 1) {
      paVar6 = ImportNode(pScene,r,meshOffsets,
                          (Ref<glTF::Node> *)
                          (*(long *)&(pNVar1->children).
                                     super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                                     ._M_impl + lVar13));
      paVar6->mParent = this;
      this->mChildren[uVar4] = paVar6;
      uVar10 = (ulong)this->mNumChildren;
      lVar13 = lVar13 + 0x10;
    }
  }
  m = &this->mTransformation;
  if ((pNVar1->matrix).isPresent == true) {
    glTFCommon::CopyValue((pNVar1->matrix).value,m);
  }
  else {
    if ((pNVar1->translation).isPresent == true) {
      temp.a4 = (pNVar1->translation).value[0];
      temp.c4 = *(float *)((long)(pNVar1->translation).value + 8);
      temp.a1 = 1.0;
      temp.a2 = 0.0;
      temp.a3 = 0.0;
      temp.b1 = 0.0;
      temp.b2 = 1.0;
      temp._24_8_ = (ulong)(uint)*(float *)((long)(pNVar1->translation).value + 4) << 0x20;
      temp.c1 = 0.0;
      temp.c2 = 0.0;
      temp.c3 = 1.0;
      temp.d3 = 0.0;
      temp.d4 = 1.0;
      temp.d1 = 0.0;
      temp.d2 = 0.0;
      aiMatrix4x4t<float>::operator*=(&temp,m);
      m->a1 = temp.a1;
      m->a2 = temp.a2;
      (this->mTransformation).a3 = temp.a3;
      (this->mTransformation).a4 = temp.a4;
      (this->mTransformation).b1 = temp.b1;
      (this->mTransformation).b2 = temp.b2;
      (this->mTransformation).b3 = temp.b3;
      (this->mTransformation).b4 = temp.b4;
      (this->mTransformation).c1 = temp.c1;
      (this->mTransformation).c2 = temp.c2;
      (this->mTransformation).c3 = temp.c3;
      (this->mTransformation).c4 = temp.c4;
      (this->mTransformation).d1 = temp.d1;
      (this->mTransformation).d2 = temp.d2;
      (this->mTransformation).d3 = temp.d3;
      (this->mTransformation).d4 = temp.d4;
    }
    if ((pNVar1->scale).isPresent == true) {
      temp.a1 = (pNVar1->scale).value[0];
      temp.b2 = *(float *)((long)(pNVar1->scale).value + 4);
      temp.c3 = *(float *)((long)(pNVar1->scale).value + 8);
      temp.a2 = 0.0;
      temp.a3 = 0.0;
      temp.a4 = 0.0;
      temp.b1 = 0.0;
      temp.b3 = 0.0;
      temp.b4 = 0.0;
      temp.c1 = 0.0;
      temp.c2 = 0.0;
      temp.c4 = 0.0;
      temp.d1 = 0.0;
      temp.d2 = 0.0;
      temp.d3 = 0.0;
      temp.d4 = 1.0;
      aiMatrix4x4t<float>::operator*=(&temp,m);
      m->a1 = temp.a1;
      m->a2 = temp.a2;
      (this->mTransformation).a3 = temp.a3;
      (this->mTransformation).a4 = temp.a4;
      (this->mTransformation).b1 = temp.b1;
      (this->mTransformation).b2 = temp.b2;
      (this->mTransformation).b3 = temp.b3;
      (this->mTransformation).b4 = temp.b4;
      (this->mTransformation).c1 = temp.c1;
      (this->mTransformation).c2 = temp.c2;
      (this->mTransformation).c3 = temp.c3;
      (this->mTransformation).c4 = temp.c4;
      (this->mTransformation).d1 = temp.d1;
      (this->mTransformation).d2 = temp.d2;
      (this->mTransformation).d3 = temp.d3;
      (this->mTransformation).d4 = temp.d4;
    }
    if ((pNVar1->rotation).isPresent == true) {
      local_a8.x = (pNVar1->rotation).value[0];
      local_a8.y = *(float *)((long)(pNVar1->rotation).value + 4);
      local_a8.z = *(float *)((long)(pNVar1->rotation).value + 8);
      local_a8.w = *(float *)((long)(pNVar1->rotation).value + 0xc);
      aiQuaterniont<float>::GetMatrix(&local_58,&local_a8);
      temp.a1 = local_58.a1;
      temp.a2 = local_58.a2;
      temp.a3 = local_58.a3;
      temp.a4 = 0.0;
      temp.b1 = local_58.b1;
      temp.b2 = local_58.b2;
      temp.b4 = 0.0;
      temp.b3 = local_58.b3;
      temp.c1 = local_58.c1;
      temp.c2 = local_58.c2;
      temp.c3 = local_58.c3;
      temp.c4 = 0.0;
      temp.d1 = 0.0;
      temp.d2 = 0.0;
      temp.d3 = 0.0;
      temp.d4 = 1.0;
      aiMatrix4x4t<float>::operator*=(&temp,m);
      m->a1 = temp.a1;
      m->a2 = temp.a2;
      (this->mTransformation).a3 = temp.a3;
      (this->mTransformation).a4 = temp.a4;
      (this->mTransformation).b1 = temp.b1;
      (this->mTransformation).b2 = temp.b2;
      (this->mTransformation).b3 = temp.b3;
      (this->mTransformation).b4 = temp.b4;
      (this->mTransformation).c1 = temp.c1;
      (this->mTransformation).c2 = temp.c2;
      (this->mTransformation).c3 = temp.c3;
      (this->mTransformation).c4 = temp.c4;
      (this->mTransformation).d1 = temp.d1;
      (this->mTransformation).d2 = temp.d2;
      (this->mTransformation).d3 = temp.d3;
      (this->mTransformation).d4 = temp.d4;
    }
  }
  pRVar12 = *(pointer *)
             &(pNVar1->meshes).
              super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>.
              _M_impl;
  pRVar14 = *(pointer *)
             ((long)&(pNVar1->meshes).
                     super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
             + 8);
  if (pRVar12 != pRVar14) {
    lVar13 = (long)pRVar14 - (long)pRVar12 >> 4;
    puVar11 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_start;
    puVar7 = &pRVar12->index;
    uVar8 = 0;
    while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
      uVar8 = (uVar8 + puVar11[(long)(int)*puVar7 + 1]) - puVar11[(int)*puVar7];
      puVar7 = puVar7 + 4;
    }
    this->mNumMeshes = uVar8;
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar8) {
      uVar4 = (long)(int)uVar8 << 2;
    }
    puVar7 = (uint *)operator_new__(uVar4);
    this->mMeshes = puVar7;
    lVar13 = 0;
    for (uVar4 = 0; uVar4 < (ulong)((long)pRVar14 - (long)pRVar12 >> 4); uVar4 = uVar4 + 1) {
      uVar8 = pRVar12[uVar4].index;
      lVar13 = (long)(int)lVar13;
      for (uVar9 = puVar11[(int)uVar8]; uVar9 < puVar11[(long)(int)uVar8 + 1]; uVar9 = uVar9 + 1) {
        this->mMeshes[lVar13] = uVar9;
        lVar13 = lVar13 + 1;
        puVar11 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      }
      pRVar12 = *(pointer *)
                 &(pNVar1->meshes).
                  super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                  ._M_impl;
      pRVar14 = *(pointer *)
                 ((long)&(pNVar1->meshes).
                         super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                 + 8);
    }
  }
  if (((pNVar1->camera).vector != (vector<glTF::Camera_*,_std::allocator<glTF::Camera_*>_> *)0x0) &&
     (paVar6 = (aiNode *)pScene->mCameras[(pNVar1->camera).index], paVar6 != this)) {
    uVar8 = (this->mName).length;
    (paVar6->mName).length = uVar8;
    memcpy((paVar6->mName).data,(this->mName).data,(ulong)uVar8);
    (paVar6->mName).data[uVar8] = '\0';
  }
  if (((pNVar1->light).vector != (vector<glTF::Light_*,_std::allocator<glTF::Light_*>_> *)0x0) &&
     (paVar6 = (aiNode *)pScene->mLights[(pNVar1->light).index], paVar6 != this)) {
    uVar8 = (this->mName).length;
    (paVar6->mName).length = uVar8;
    memcpy((paVar6->mName).data,(this->mName).data,(ulong)uVar8);
    (paVar6->mName).data[uVar8] = '\0';
  }
  return this;
}

Assistant:

aiNode* ImportNode(aiScene* pScene, glTF::Asset& r, std::vector<unsigned int>& meshOffsets, glTF::Ref<glTF::Node>& ptr)
{
    Node& node = *ptr;

    aiNode* ainode = new aiNode(node.id);

    if (!node.children.empty()) {
        ainode->mNumChildren = unsigned(node.children.size());
        ainode->mChildren = new aiNode*[ainode->mNumChildren];

        for (unsigned int i = 0; i < ainode->mNumChildren; ++i) {
            aiNode* child = ImportNode(pScene, r, meshOffsets, node.children[i]);
            child->mParent = ainode;
            ainode->mChildren[i] = child;
        }
    }

    aiMatrix4x4& matrix = ainode->mTransformation;
    if (node.matrix.isPresent) {
        CopyValue(node.matrix.value, matrix);
    }
    else {
        if (node.translation.isPresent) {
            aiVector3D trans;
            CopyValue(node.translation.value, trans);
            aiMatrix4x4 t;
            aiMatrix4x4::Translation(trans, t);
            matrix = t * matrix;
        }

        if (node.scale.isPresent) {
            aiVector3D scal(1.f);
            CopyValue(node.scale.value, scal);
            aiMatrix4x4 s;
            aiMatrix4x4::Scaling(scal, s);
            matrix = s * matrix;
        }


        if (node.rotation.isPresent) {
            aiQuaternion rot;
            CopyValue(node.rotation.value, rot);
            matrix = aiMatrix4x4(rot.GetMatrix()) * matrix;
        }
    }

    if (!node.meshes.empty()) {
        int count = 0;
        for (size_t i = 0; i < node.meshes.size(); ++i) {
            int idx = node.meshes[i].GetIndex();
            count += meshOffsets[idx + 1] - meshOffsets[idx];
        }

        ainode->mNumMeshes = count;
        ainode->mMeshes = new unsigned int[count];

        int k = 0;
        for (size_t i = 0; i < node.meshes.size(); ++i) {
            int idx = node.meshes[i].GetIndex();
            for (unsigned int j = meshOffsets[idx]; j < meshOffsets[idx + 1]; ++j, ++k) {
                ainode->mMeshes[k] = j;
            }
        }
    }

    if (node.camera) {
        pScene->mCameras[node.camera.GetIndex()]->mName = ainode->mName;
    }

    if (node.light) {
        pScene->mLights[node.light.GetIndex()]->mName = ainode->mName;
    }

    return ainode;
}